

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O2

void cmExtraEclipseCDT4Generator::AppendIncludeDirectories
               (cmGeneratedFileStream *fout,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *includeDirs,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *emittedDirs)

{
  bool bVar1;
  iterator iVar2;
  ostream *poVar3;
  pointer in_relative;
  string local_160;
  string local_140;
  string dir;
  RegularExpression frameworkRx;
  
  for (in_relative = (includeDirs->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
      in_relative !=
      (includeDirs->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish; in_relative = in_relative + 1) {
    if (in_relative->_M_string_length != 0) {
      cmsys::SystemTools::CollapseFullPath(&dir,in_relative);
      cmsys::RegularExpression::RegularExpression(&frameworkRx,"(.+/Frameworks)/.+\\.framework/");
      bVar1 = cmsys::RegularExpression::find(&frameworkRx,dir._M_dataplus._M_p);
      if (bVar1) {
        cmsys::RegularExpression::match_abi_cxx11_(&local_160,&frameworkRx,1);
        std::__cxx11::string::operator=((string *)&dir,(string *)&local_160);
        std::__cxx11::string::~string((string *)&local_160);
      }
      iVar2 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&emittedDirs->_M_t,&dir);
      if ((_Rb_tree_header *)iVar2._M_node == &(emittedDirs->_M_t)._M_impl.super__Rb_tree_header) {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)emittedDirs,&dir);
        poVar3 = std::operator<<((ostream *)fout,"<pathentry include=\"");
        std::__cxx11::string::string((string *)&local_140,(string *)&dir);
        EscapeForXML(&local_160,&local_140);
        poVar3 = std::operator<<(poVar3,(string *)&local_160);
        std::operator<<(poVar3,"\" kind=\"inc\" path=\"\" system=\"true\"/>\n");
        std::__cxx11::string::~string((string *)&local_160);
        std::__cxx11::string::~string((string *)&local_140);
      }
      cmsys::RegularExpression::~RegularExpression(&frameworkRx);
      std::__cxx11::string::~string((string *)&dir);
    }
  }
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::AppendIncludeDirectories(
                            cmGeneratedFileStream& fout,
                            const std::vector<std::string>& includeDirs,
                            std::set<std::string>& emittedDirs)
{
  for(std::vector<std::string>::const_iterator inc = includeDirs.begin();
      inc != includeDirs.end();
      ++inc)
    {
    if (!inc->empty())
      {
      std::string dir = cmSystemTools::CollapseFullPath(*inc);

      // handle framework include dirs on OSX, the remainder after the
      // Frameworks/ part has to be stripped
      //   /System/Library/Frameworks/GLUT.framework/Headers
      cmsys::RegularExpression frameworkRx("(.+/Frameworks)/.+\\.framework/");
      if(frameworkRx.find(dir.c_str()))
        {
        dir = frameworkRx.match(1);
        }

      if(emittedDirs.find(dir) == emittedDirs.end())
        {
        emittedDirs.insert(dir);
        fout << "<pathentry include=\""
             << cmExtraEclipseCDT4Generator::EscapeForXML(
                              cmExtraEclipseCDT4Generator::GetEclipsePath(dir))
             << "\" kind=\"inc\" path=\"\" system=\"true\"/>\n";
        }
      }
    }
}